

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTableIterator::~MemTableIterator(MemTableIterator *this)

{
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__MemTableIterator_001531b0;
  std::__cxx11::string::~string((string *)&this->tmp_);
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

~MemTableIterator() override = default;